

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

bool Js::JavascriptExternalFunction::DeferredLengthInitializer
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *scriptContext;
  JavascriptExternalFunction *object;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *instance_local;
  
  JavascriptLibrary::InitializeFunction<true,true,true,true>(instance,typeHandler,mode);
  scriptContext = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  UndeferLength((JavascriptExternalFunction *)instance,scriptContext);
  return true;
}

Assistant:

bool __cdecl JavascriptExternalFunction::DeferredLengthInitializer(DynamicObject * instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        Js::JavascriptLibrary::InitializeFunction<true, true, true, true>(instance, typeHandler, mode);

        JavascriptExternalFunction* object = static_cast<JavascriptExternalFunction*>(instance);

        object->UndeferLength(instance->GetScriptContext());

        return true;
    }